

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double find_split_std_gain_t<long_double,float>
                 (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 GainCriterion criterion,double min_gain,double *split_point,size_t *split_ix)

{
  float *pfVar1;
  float fVar2;
  long lVar3;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar6;
  float in_XMM0_Da;
  double dVar7;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double *in_stack_00000008;
  ulong *in_stack_00000010;
  size_t row;
  longdouble this_gain;
  longdouble this_sd;
  longdouble n;
  longdouble best_gain;
  longdouble mean_prev;
  longdouble running_ssq;
  longdouble running_mean;
  longdouble full_sd;
  longdouble in_stack_fffffffffffffec8;
  longdouble local_128;
  longdouble local_11c;
  ulong local_d0;
  double *in_stack_ffffffffffffff68;
  undefined8 uVar8;
  undefined2 in_stack_ffffffffffffff70;
  undefined2 uVar9;
  undefined6 in_stack_ffffffffffffff72;
  size_t in_stack_ffffffffffffff78;
  undefined8 uVar10;
  undefined2 in_stack_ffffffffffffff80;
  undefined2 uVar11;
  undefined6 in_stack_ffffffffffffff82;
  undefined4 local_78;
  float in_stack_ffffffffffffff8c;
  undefined4 uVar12;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 uVar13;
  undefined6 in_stack_ffffffffffffff92;
  longdouble local_68;
  
  calc_sd_right_to_left<long_double,float>
            ((float *)CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c,
             (size_t *)CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78,CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)
             ,in_stack_ffffffffffffff68);
  local_68 = (longdouble)0;
  local_78 = SUB104(local_68,0);
  uVar12 = (undefined4)((unkuint10)local_68 >> 0x20);
  uVar13 = (undefined2)((unkuint10)local_68 >> 0x40);
  lVar4 = (longdouble)(*(float *)(in_RDI + *(long *)(in_RSI + in_RDX * 8) * 4) - in_XMM0_Da);
  uVar10 = SUB108(lVar4,0);
  uVar11 = (undefined2)((unkuint10)lVar4 >> 0x40);
  uVar8 = SUB108((longdouble)-INFINITY,0);
  uVar9 = (undefined2)((unkuint10)(longdouble)-INFINITY >> 0x40);
  lVar3 = (in_RCX - in_RDX) + 1;
  lVar4 = (longdouble)(float)(&DAT_006c0110)[lVar3 < 0] + (longdouble)lVar3;
  *in_stack_00000010 = in_RDX;
  for (local_d0 = in_RDX; local_d0 < in_RCX; local_d0 = local_d0 + 1) {
    lVar3 = (local_d0 - in_RDX) + 1;
    local_68 = local_68 +
               ((longdouble)(*(float *)(in_RDI + *(long *)(in_RSI + local_d0 * 8) * 4) - in_XMM0_Da)
               - local_68) / ((longdouble)(float)(&DAT_006c0110)[lVar3 < 0] + (longdouble)lVar3);
    lVar5 = (longdouble)(*(float *)(in_RDI + *(long *)(in_RSI + local_d0 * 8) * 4) - in_XMM0_Da);
    lVar5 = (longdouble)CONCAT28(uVar13,CONCAT44(uVar12,local_78)) +
            (lVar5 - local_68) * (lVar5 - (longdouble)CONCAT28(uVar11,uVar10));
    local_78 = SUB104(lVar5,0);
    uVar12 = (undefined4)((unkuint10)lVar5 >> 0x20);
    uVar13 = (undefined2)((unkuint10)lVar5 >> 0x40);
    uVar10 = SUB108(local_68,0);
    uVar11 = (undefined2)((unkuint10)local_68 >> 0x40);
    fVar2 = *(float *)(in_RDI + *(long *)(in_RSI + local_d0 * 8) * 4);
    pfVar1 = (float *)(in_RDI + *(long *)(in_RSI + 8 + local_d0 * 8) * 4);
    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
      if (local_d0 == in_RDX) {
        local_11c = (longdouble)0;
        lVar5 = in_ST1;
      }
      else {
        lVar3 = (local_d0 - in_RDX) + 1;
        in_stack_fffffffffffffec8 =
             lVar5 / ((longdouble)(float)(&DAT_006c0110)[lVar3 < 0] + (longdouble)lVar3);
        lVar6 = in_ST4;
        std::sqrt((double)(ulong)(uint)fVar2);
        lVar5 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = lVar6;
        local_11c = in_ST1;
      }
      in_ST1 = lVar5;
      if (in_R9D == 2) {
        lVar3 = (local_d0 + 1) - in_RDX;
        local_128 = (longdouble)1 +
                    -((longdouble)1 / in_ST0) *
                    ((longdouble)*(double *)(in_R8 + 8 + (local_d0 - in_RDX) * 8) *
                     (((longdouble)(float)(&DAT_006c0110)[(long)(in_RCX - local_d0) < 0] +
                      (longdouble)(long)(in_RCX - local_d0)) / lVar4) +
                    local_11c *
                    (((longdouble)(float)(&DAT_006c0110)[lVar3 < 0] + (longdouble)lVar3) / lVar4));
        in_ST3 = in_ST2;
        in_ST4 = in_ST2;
      }
      else {
        local_128 = (longdouble)1 -
                    ((longdouble)*(double *)(in_R8 + 8 + (local_d0 - in_RDX) * 8) + local_11c) /
                    (in_ST0 + in_ST0);
      }
      if (((longdouble)CONCAT28(uVar9,uVar8) < local_128) &&
         ((longdouble)(double)CONCAT44(in_XMM1_Db,in_XMM1_Da) < local_128)) {
        uVar8 = SUB108(local_128,0);
        uVar9 = (undefined2)((unkuint10)local_128 >> 0x40);
        *in_stack_00000010 = local_d0;
      }
    }
  }
  if ((longdouble)-INFINITY < (longdouble)CONCAT28(uVar9,uVar8)) {
    dVar7 = midpoint<float>((float)((unkuint10)in_stack_fffffffffffffec8 >> 0x20),
                            SUB104(in_stack_fffffffffffffec8,0));
    *in_stack_00000008 = dVar7;
  }
  return (double)(longdouble)CONCAT28(uVar9,uVar8);
}

Assistant:

double find_split_std_gain_t(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr,
                             GainCriterion criterion, double min_gain, double &restrict split_point, size_t &restrict split_ix)
{
    real_t full_sd = calc_sd_right_to_left<real_t>(x, xmean, ix_arr, st, end, sd_arr);
    real_t running_mean = 0;
    real_t running_ssq = 0;
    real_t mean_prev = x[ix_arr[st]] - xmean;
    real_t best_gain = -HUGE_VAL;
    real_t n = (real_t)(end - st + 1);
    real_t this_sd, this_gain;
    split_ix = st;
    for (size_t row = st; row < end; row++)
    {
        running_mean   += ((x[ix_arr[row]] - xmean) - running_mean) / (real_t)(row-st+1);
        running_ssq    += ((x[ix_arr[row]] - xmean) - running_mean) * ((x[ix_arr[row]] - xmean) - mean_prev);
        mean_prev       =  running_mean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        this_sd = (row == st)? 0. : std::sqrt(running_ssq / (real_t)(row-st+1));
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, n, this_sd, sd_arr[row-st+1], row-st+1, end-row)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row-st+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }
    
    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);

    return best_gain;
}